

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mcomp.c
# Opt level: O0

int mv_err_cost_(MV *mv,MV_COST_PARAMS *mv_cost_params)

{
  long in_RSI;
  MV *in_stack_00000010;
  MV *in_stack_00000018;
  MV_COST_TYPE in_stack_fffffffffffffffb;
  int in_stack_fffffffffffffffc;
  int iVar1;
  
  if (*(char *)(in_RSI + 0xc) == '\x04') {
    iVar1 = 0;
  }
  else {
    iVar1 = mv_err_cost(in_stack_00000018,in_stack_00000010,(int *)mv,(int **)mv_cost_params,
                        in_stack_fffffffffffffffc,in_stack_fffffffffffffffb);
  }
  return iVar1;
}

Assistant:

static inline int mv_err_cost_(const MV *mv,
                               const MV_COST_PARAMS *mv_cost_params) {
  if (mv_cost_params->mv_cost_type == MV_COST_NONE) {
    return 0;
  }
  return mv_err_cost(mv, mv_cost_params->ref_mv, mv_cost_params->mvjcost,
                     mv_cost_params->mvcost, mv_cost_params->error_per_bit,
                     mv_cost_params->mv_cost_type);
}